

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O0

void phosg::strip_multiline_comments<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               bool allow_unterminated)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  runtime_error *this;
  ulong local_28;
  size_t z;
  size_t write_offset;
  bool is_in_comment;
  bool allow_unterminated_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  
  bVar2 = false;
  z = 0;
  local_28 = 0;
  while (sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(s), local_28 < sVar3) {
    if (bVar2) {
      pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,local_28);
      if (((*pvVar4 == '*') &&
          (sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::size(s), local_28 + 1 < sVar3)) &&
         (pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,local_28 + 1), *pvVar4 == '/')) {
        bVar2 = false;
        local_28 = local_28 + 2;
      }
      else {
        uVar5 = local_28 + 1;
        pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,local_28);
        local_28 = uVar5;
        if (*pvVar4 == '\n') {
          pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,z);
          *pvVar4 = '\n';
          z = z + 1;
        }
      }
    }
    else {
      pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,local_28);
      if (((*pvVar4 == '/') &&
          (sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::size(s), local_28 + 1 < sVar3)) &&
         (pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,local_28 + 1), *pvVar4 == '*')) {
        bVar2 = true;
        local_28 = local_28 + 2;
      }
      else {
        pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,local_28);
        vVar1 = *pvVar4;
        pvVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,z);
        *pvVar4 = vVar1;
        local_28 = local_28 + 1;
        z = z + 1;
      }
    }
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(s,z);
  if ((!allow_unterminated) && (bVar2)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,"unterminated multiline comment");
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void strip_multiline_comments(StrT& s, bool allow_unterminated = false) {
  bool is_in_comment = false;
  size_t write_offset = 0;
  for (size_t z = 0; z < s.size();) {
    if (!is_in_comment) {
      if ((s[z] == '/') && (z + 1 < s.size()) && (s[z + 1] == '*')) {
        is_in_comment = true;
        z += 2;
      } else {
        s[write_offset++] = s[z++];
      }
    } else {
      if ((s[z] == '*') && (z + 1 < s.size()) && (s[z + 1] == '/')) {
        is_in_comment = false;
        z += 2;
      } else {
        if (s[z++] == '\n') {
          s[write_offset++] = '\n';
        }
      }
    }
  }
  s.resize(write_offset);

  if (!allow_unterminated && is_in_comment) {
    throw std::runtime_error("unterminated multiline comment");
  }
}